

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

GLogColor google::SeverityToColor(LogSeverity severity)

{
  GLogColor local_c;
  LogSeverity severity_local;
  
  if (severity == GLOG_INFO) {
    local_c = COLOR_DEFAULT;
  }
  else if (severity == GLOG_WARNING) {
    local_c = COLOR_YELLOW;
  }
  else {
    if (1 < severity - ERROR) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                    ,0xec,"GLogColor google::SeverityToColor(LogSeverity)");
    }
    local_c = COLOR_RED;
  }
  return local_c;
}

Assistant:

static GLogColor SeverityToColor(LogSeverity severity) {
  switch (severity) {
    case GLOG_INFO:
      return COLOR_DEFAULT;
    case GLOG_WARNING:
      return COLOR_YELLOW;
    case GLOG_ERROR:
    case GLOG_FATAL:
      return COLOR_RED;
  }

  // should never get here.
  GLOG_UNREACHABLE;
}